

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O1

int Delete(BiTree *p)

{
  BiTree __ptr;
  BiTree pBVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  BiTree __ptr_00;
  BiTree pBVar2;
  
  __ptr = *p;
  pBVar1 = __ptr->lchild;
  if (__ptr->rchlid == (BiTNode *)0x0) {
    *p = pBVar1;
    free(__ptr);
    return extraout_EAX_00;
  }
  __ptr_00 = __ptr;
  if (pBVar1 == (BiTree)0x0) {
    *p = __ptr->rchlid;
    free(__ptr);
    return extraout_EAX_01;
  }
  do {
    pBVar2 = __ptr_00;
    __ptr_00 = pBVar1;
    pBVar1 = __ptr_00->rchlid;
  } while (__ptr_00->rchlid != (BiTNode *)0x0);
  __ptr->data = __ptr_00->data;
  pBVar2->lchild = __ptr_00->lchild;
  free(__ptr_00);
  return extraout_EAX;
}

Assistant:

int Delete(BiTree *p){
    BiTree q,s;

    if((*p)->rchlid == NULL){     //右子树为空，重接他的左子树
        q = *p;
        *p = (*p)->lchild;
        free(q);
    } else if((*p)->lchild == NULL){  //左子树为空，重接他的右子树
        q = *p;
        *p = (*p)->rchlid;
        free(q);
    }else{                            //左右子树都部位空
        q = *p;
        s = (*p)->lchild;
        while(s->rchlid){             //找到左子树的最右子树
            q = s;
            s = s->rchlid;
        }

        (*p)->data = s->data;         //s指向被删除结点的直接前驱（将被删除结点的值改为直接前驱结点的值）

        q->lchild = s->lchild;    //重接q的左子树

        free(s);
    }
}